

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-io.c
# Opt level: O0

errr borg_what_text(wchar_t x,wchar_t y,wchar_t n,uint8_t *a,char *s)

{
  wchar_t wVar1;
  wchar_t *pwVar2;
  wchar_t *pwVar3;
  wchar_t local_107c;
  wchar_t local_1064;
  wchar_t local_1060;
  wchar_t local_105c;
  wchar_t m;
  wchar_t d_a;
  wchar_t h;
  wchar_t w;
  wchar_t *cc;
  wchar_t *aa;
  wchar_t t_c;
  wchar_t t_a;
  wchar_t screen_str [1024];
  wchar_t local_2c;
  wchar_t i;
  char *s_local;
  uint8_t *a_local;
  wchar_t n_local;
  wchar_t y_local;
  wchar_t x_local;
  
  local_105c = L'\0';
  local_1064 = n;
  if (n < L'\0') {
    local_1064 = -n;
  }
  local_1060 = local_1064;
  Term_get_size(&d_a,&m);
  if (d_a < x + local_1064) {
    local_1060 = d_a - x;
  }
  _h = Term->scr->c[y] + x;
  cc = Term->scr->a[y] + x;
  for (local_2c = L'\0'; local_2c < local_1060; local_2c = local_2c + L'\x01') {
    pwVar2 = cc + 1;
    aa._4_4_ = *cc;
    pwVar3 = _h + 1;
    aa._0_4_ = *_h;
    _h = pwVar3;
    cc = pwVar2;
    if (((wchar_t)aa == L' ') || (aa._4_4_ == L'\0')) {
      (&t_c)[local_2c] = L' ';
    }
    else {
      wVar1 = aa._4_4_;
      if ((local_105c != L'\0') && (wVar1 = local_105c, aa._4_4_ != local_105c)) break;
      local_105c = wVar1;
      (&t_c)[local_2c] = (wchar_t)aa;
    }
  }
  (&t_c)[local_2c] = L'\0';
  *a = (uint8_t)local_105c;
  local_107c = n;
  if (n < L'\0') {
    local_107c = -n;
  }
  wcstombs(s,&t_c,(long)(local_107c + L'\x01'));
  if ((n < L'\x01') || (local_2c == n)) {
    y_local = L'\0';
  }
  else {
    y_local = L'\x01';
  }
  return y_local;
}

Assistant:

errr borg_what_text(int x, int y, int n, uint8_t *a, char *s)
{
    int     i;
    wchar_t screen_str[1024];

    int     t_a;
    wchar_t t_c;

    int     *aa;
    wchar_t *cc;

    int w, h;

    /* Current attribute */
    int d_a = 0;

    /* Max length to scan for */
    int m = ABS(n);

    /* Activate */
    /* Do I need to get the right window? Term_activate(angband_term[0]); */

    /* Obtain the size */
    (void)Term_get_size(&w, &h);

    /* Hack -- Do not run off the screen */
    if (x + m > w)
        m = w - x;

    /* Direct access XXX XXX XXX */
    aa = &(Term->scr->a[y][x]);
    cc = &(Term->scr->c[y][x]);

    /* Grab the string */
    for (i = 0; i < m; i++) {
        /* Access */
        t_a = *aa++;
        t_c = *cc++;

        /* Handle spaces */
        if ((t_c == L' ') || !t_a) {
            /* Save space */
            screen_str[i] = L' ';
        }

        /* Handle real text */
        else {
            /* Attribute ready */
            if (d_a) {
                /* Verify the "attribute" (or stop) */
                if (t_a != d_a)
                    break;
            }

            /* Acquire attribute */
            else {
                /* Save it */
                d_a = t_a;
            }

            /* Save char */
            screen_str[i] = t_c;
        }
    }

    /* Terminate the string */
    screen_str[i] = L'\0';

    /* Save the attribute */
    (*a) = d_a;

    /* Convert back to a char string */
    wcstombs(s, screen_str, ABS(n) + 1);
    /* Too short */
    if ((n > 0) && (i != n))
        return 1;

    /* Success */
    return 0;
}